

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

SquareMatrix<2> __thiscall pbrt::SquareMatrix<2>::operator/(SquareMatrix<2> *this,Float s)

{
  Float aFVar1 [2];
  int i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  SquareMatrix<2> SVar5;
  SquareMatrix<2> r;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  
  r.m[0] = this->m[0];
  r.m[1] = this->m[1];
  auVar3._4_4_ = s;
  auVar3._0_4_ = s;
  auVar3._8_4_ = s;
  auVar3._12_4_ = s;
  lVar2 = 0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = r.m[lVar2];
    auVar4 = vdivps_avx(auVar4,auVar3);
    aFVar1 = (Float  [2])vmovlps_avx(auVar4);
    r.m[lVar2] = aFVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  SVar5.m[0][0] = r.m[0][0];
  auVar6._4_4_ = r.m[0][1];
  register0x00001240 = r.m[1][0];
  register0x00001244 = r.m[1][1];
  return (SquareMatrix<2>)SVar5.m;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }